

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_window_close(nk_context *ctx,char *name)

{
  nk_window *pnVar1;
  nk_context *in_RSI;
  long in_RDI;
  nk_window *win;
  char *in_stack_ffffffffffffffe8;
  
  if (((in_RDI != 0) &&
      (pnVar1 = nk_window_find(in_RSI,in_stack_ffffffffffffffe8), pnVar1 != (nk_window *)0x0)) &&
     (*(nk_window **)(in_RDI + 0x40d8) != pnVar1)) {
    pnVar1->flags = pnVar1->flags | 0x2000;
    pnVar1->flags = pnVar1->flags | 0x4000;
  }
  return;
}

Assistant:

NK_API void
nk_window_close(struct nk_context *ctx, const char *name)
{
struct nk_window *win;
NK_ASSERT(ctx);
if (!ctx) return;
win = nk_window_find(ctx, name);
if (!win) return;
NK_ASSERT(ctx->current != win && "You cannot close a currently active window");
if (ctx->current == win) return;
win->flags |= NK_WINDOW_HIDDEN;
win->flags |= NK_WINDOW_CLOSED;
}